

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btMultiBodyDynamicsWorld.cpp
# Opt level: O1

void __thiscall btMultiBodyDynamicsWorld::debugDrawWorld(btMultiBodyDynamicsWorld *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  btMultiBody *this_00;
  btMultibodyLink *pbVar3;
  btMultibodyLink *pbVar4;
  int iVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  btMatrix3x3 *this_01;
  long lVar7;
  long lVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  btVector3 to;
  btVector3 from;
  btTransform tr;
  btAlignedObjectArray<btVector3> local_origin1;
  btAlignedObjectArray<btQuaternion> world_to_local1;
  btQuaternion local_138;
  undefined8 local_128;
  undefined8 uStack_120;
  float local_118;
  float fStack_114;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  float local_f8;
  float fStack_f4;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  btMatrix3x3 local_b8;
  undefined8 local_88;
  undefined8 uStack_80;
  long local_78;
  btAlignedObjectArray<btVector3> local_70;
  btAlignedObjectArray<btQuaternion> local_50;
  
  CProfileManager::Start_Profile("btMultiBodyDynamicsWorld debugDrawWorld");
  iVar5 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
            _vptr_btCollisionWorld[5])(this);
  if (CONCAT44(extraout_var,iVar5) != 0) {
    iVar5 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
              _vptr_btCollisionWorld[5])(this);
    uVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar5) + 0x70))
                      ((long *)CONCAT44(extraout_var_00,iVar5));
    if ((uVar6 & 0x1800) != 0) {
      CProfileManager::Start_Profile("btMultiBody debugDrawWorld");
      local_50.m_ownsMemory = true;
      local_50.m_data = (btQuaternion *)0x0;
      local_50.m_size = 0;
      local_50.m_capacity = 0;
      local_70.m_ownsMemory = true;
      local_70.m_data = (btVector3 *)0x0;
      local_70.m_size = 0;
      local_70.m_capacity = 0;
      if (0 < (this->m_multiBodyConstraints).m_size) {
        lVar7 = 0;
        do {
          (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.super_btCollisionWorld.
            _vptr_btCollisionWorld[0x37])(this,(this->m_multiBodyConstraints).m_data[lVar7]);
          lVar7 = lVar7 + 1;
        } while (lVar7 < (this->m_multiBodyConstraints).m_size);
      }
      if (0 < (this->m_multiBodies).m_size) {
        lVar7 = 0;
        do {
          this_00 = (this->m_multiBodies).m_data[lVar7];
          btMultiBody::forwardKinematics(this_00,&local_50,&local_70);
          iVar5 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                    super_btCollisionWorld._vptr_btCollisionWorld[5])(this);
          local_88 = *(undefined8 *)(this_00->m_basePos).m_floats;
          uStack_80 = *(undefined8 *)((this_00->m_basePos).m_floats + 2);
          local_138.super_btQuadWord.m_floats._0_8_ =
               *(ulong *)(this_00->m_baseQuat).super_btQuadWord.m_floats ^ 0x8000000080000000;
          local_138.super_btQuadWord.m_floats._8_8_ =
               *(ulong *)((this_00->m_baseQuat).super_btQuadWord.m_floats + 2) ^ 0x80000000;
          local_78 = lVar7;
          btMatrix3x3::setRotation(&local_b8,&local_138);
          (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar5) + 0x80))
                    (0x3dcccccd,(long *)CONCAT44(extraout_var_01,iVar5),&local_b8);
          if (0 < (this_00->m_links).m_size) {
            lVar8 = 0;
            lVar7 = 0;
            do {
              pbVar3 = (this_00->m_links).m_data;
              iVar5 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                        super_btCollisionWorld._vptr_btCollisionWorld[5])();
              this_01 = (btMatrix3x3 *)
                        ((long)(pbVar3->m_cachedWorldTransform).m_basis.m_el[0].m_floats + lVar8);
              (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar5) + 0x80))
                        (0x3dcccccd,(long *)CONCAT44(extraout_var_02,iVar5),this_01);
              if (*(int *)((long)(((this_00->m_links).m_data)->m_cachedWorldTransform).m_basis.m_el
                                 [0].m_floats + lVar8 + -0xc) == 0) {
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                local_f8 = local_b8.m_el[0].m_floats[0];
                fStack_f4 = local_b8.m_el[0].m_floats[1];
                uStack_f0 = 0;
                local_118 = local_b8.m_el[0].m_floats[2];
                fStack_114 = local_b8.m_el[0].m_floats[3];
                uStack_110 = 0;
                pbVar4 = (this_00->m_links).m_data;
                local_e8 = ZEXT416(*(uint *)((long)pbVar4->m_axes[0].m_topVec.m_floats + lVar8 + 8))
                ;
                local_128 = *(undefined8 *)((long)pbVar4->m_axes[0].m_topVec.m_floats + lVar8);
                uStack_120 = 0;
                local_138.super_btQuadWord.m_floats[0] = 0.0;
                local_138.super_btQuadWord.m_floats[1] = 0.0;
                local_138.super_btQuadWord.m_floats[2] = 0.0;
                local_138.super_btQuadWord.m_floats[3] = 1.0;
                local_108 = *(undefined8 *)
                             ((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8);
                uStack_100 = 0;
                fVar11 = *(float *)((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats +
                                   lVar8 + 8);
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                fVar17 = (fStack_114 * local_128._4_4_ + local_118 * (float)local_128) -
                         local_f8 * (float)local_e8._0_4_;
                fVar15 = local_b8.m_el[0].m_floats[0];
                fVar16 = local_b8.m_el[0].m_floats[1];
                fVar19 = -fStack_f4;
                fVar21 = -local_118;
                fVar23 = fVar21 * (float)local_e8._0_4_ +
                         (local_128._4_4_ * fVar19 - local_f8 * (float)local_128);
                pbVar4 = (this_00->m_links).m_data;
                fVar26 = ((float)local_e8._0_4_ * fStack_114 + local_128._4_4_ * local_f8) -
                         (float)local_128 * fStack_f4;
                fVar27 = ((float)local_128 * fStack_114 + (float)local_e8._0_4_ * fStack_f4) -
                         local_128._4_4_ * local_118;
                fVar12 = local_b8.m_el[0].m_floats[2];
                fVar13 = local_b8.m_el[0].m_floats[3];
                fVar14 = *(float *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 8);
                uVar1 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8);
                uVar2 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 4);
                fVar24 = (float)uVar1;
                fVar25 = (float)((ulong)uVar1 >> 0x20);
                fVar18 = (fVar13 * fVar25 + fVar12 * fVar24) - fVar15 * fVar14;
                fVar20 = (fVar14 * fVar13 + (float)uVar2 * fVar15) - fVar16 * fVar24;
                fVar22 = (fVar24 * fVar13 + (float)((ulong)uVar2 >> 0x20) * fVar16) -
                         fVar12 * fVar25;
                fVar9 = -fVar16;
                fVar10 = -fVar12;
                fVar14 = fVar14 * fVar10 + (fVar25 * fVar9 - fVar24 * fVar15);
                local_c8._4_4_ =
                     (fVar27 * local_118 +
                      -local_f8 * fVar26 + fVar19 * fVar23 + fVar17 * fStack_114 + local_108._4_4_)
                     - (fVar12 * fVar22 + -fVar15 * fVar20 + fVar9 * fVar14 + fVar18 * fVar13);
                local_c8._0_4_ =
                     (fVar26 * fStack_f4 +
                      fVar21 * fVar17 + -local_f8 * fVar23 + fVar27 * fStack_114 + (float)local_108)
                     - (fVar16 * fVar20 + fVar10 * fVar18 + -fVar15 * fVar14 + fVar22 * fVar13);
                local_c8._8_4_ =
                     (local_f8 * fVar17 + fVar27 * fVar19 + fVar21 * fVar23 + fStack_114 * fVar26 +
                     fVar11) - (fVar18 * fVar15 + fVar22 * fVar9 + fVar14 * fVar10 + fVar20 * fVar13
                               );
                local_c8._12_4_ = 0;
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                fVar14 = local_b8.m_el[0].m_floats[2];
                fVar9 = local_b8.m_el[0].m_floats[3];
                pbVar4 = (this_00->m_links).m_data;
                fVar11 = *(float *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 8);
                uVar1 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8);
                uVar2 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 4);
                fVar17 = (float)uVar1;
                fVar18 = (float)((ulong)uVar1 >> 0x20);
                fVar12 = local_b8.m_el[0].m_floats[0];
                fVar10 = (fVar9 * fVar18 + fVar14 * fVar17) - fVar12 * fVar11;
                fVar13 = local_b8.m_el[0].m_floats[1];
                fVar15 = (fVar11 * fVar9 + (float)uVar2 * fVar12) - fVar13 * fVar17;
                fVar16 = (fVar17 * fVar9 + (float)((ulong)uVar2 >> 0x20) * fVar13) - fVar14 * fVar18
                ;
                fVar19 = -fVar13;
                fVar20 = -fVar14;
                fVar11 = fVar11 * fVar20 + (fVar18 * fVar19 - fVar17 * fVar12);
                uVar1 = *(undefined8 *)
                         ((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8);
                local_d8._4_4_ =
                     (float)((ulong)uVar1 >> 0x20) -
                     (fVar14 * fVar16 + -fVar12 * fVar15 + fVar19 * fVar11 + fVar10 * fVar9);
                local_d8._0_4_ =
                     (float)uVar1 -
                     (fVar13 * fVar15 + fVar20 * fVar10 + -fVar12 * fVar11 + fVar16 * fVar9);
                local_d8._8_4_ =
                     *(float *)((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8 + 8
                               ) -
                     (fVar10 * fVar12 + fVar16 * fVar19 + fVar11 * fVar20 + fVar15 * fVar9);
                local_d8._12_4_ = 0;
                iVar5 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                          super_btCollisionWorld._vptr_btCollisionWorld[5])();
                (**(code **)(*(long *)CONCAT44(extraout_var_03,iVar5) + 0x20))
                          ((long *)CONCAT44(extraout_var_03,iVar5),local_c8,local_d8,&local_138);
              }
              if (*(int *)((long)(((this_00->m_links).m_data)->m_cachedWorldTransform).m_basis.m_el
                                 [0].m_floats + lVar8 + -0xc) == 4) {
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                local_f8 = local_b8.m_el[0].m_floats[0];
                fStack_f4 = local_b8.m_el[0].m_floats[1];
                uStack_f0 = 0;
                local_118 = local_b8.m_el[0].m_floats[2];
                fStack_114 = local_b8.m_el[0].m_floats[3];
                uStack_110 = 0;
                pbVar4 = (this_00->m_links).m_data;
                local_e8 = ZEXT416(*(uint *)((long)pbVar4->m_axes[0].m_bottomVec.m_floats +
                                            lVar8 + 8));
                local_128 = *(undefined8 *)((long)pbVar4->m_axes[0].m_bottomVec.m_floats + lVar8);
                uStack_120 = 0;
                local_138.super_btQuadWord.m_floats[0] = 0.0;
                local_138.super_btQuadWord.m_floats[1] = 0.0;
                local_138.super_btQuadWord.m_floats[2] = 0.0;
                local_138.super_btQuadWord.m_floats[3] = 1.0;
                local_108 = *(undefined8 *)
                             ((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8);
                uStack_100 = 0;
                fVar11 = *(float *)((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats +
                                   lVar8 + 8);
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                fVar17 = (fStack_114 * local_128._4_4_ + local_118 * (float)local_128) -
                         local_f8 * (float)local_e8._0_4_;
                fVar15 = local_b8.m_el[0].m_floats[0];
                fVar16 = local_b8.m_el[0].m_floats[1];
                fVar19 = -fStack_f4;
                fVar21 = -local_118;
                fVar23 = fVar21 * (float)local_e8._0_4_ +
                         (local_128._4_4_ * fVar19 - local_f8 * (float)local_128);
                pbVar4 = (this_00->m_links).m_data;
                fVar26 = ((float)local_e8._0_4_ * fStack_114 + local_128._4_4_ * local_f8) -
                         (float)local_128 * fStack_f4;
                fVar27 = ((float)local_128 * fStack_114 + (float)local_e8._0_4_ * fStack_f4) -
                         local_128._4_4_ * local_118;
                fVar12 = local_b8.m_el[0].m_floats[2];
                fVar13 = local_b8.m_el[0].m_floats[3];
                fVar14 = *(float *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 8);
                uVar1 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8);
                uVar2 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 4);
                fVar24 = (float)uVar1;
                fVar25 = (float)((ulong)uVar1 >> 0x20);
                fVar18 = (fVar13 * fVar25 + fVar12 * fVar24) - fVar15 * fVar14;
                fVar20 = (fVar14 * fVar13 + (float)uVar2 * fVar15) - fVar16 * fVar24;
                fVar22 = (fVar24 * fVar13 + (float)((ulong)uVar2 >> 0x20) * fVar16) -
                         fVar12 * fVar25;
                fVar9 = -fVar16;
                fVar10 = -fVar12;
                fVar14 = fVar14 * fVar10 + (fVar25 * fVar9 - fVar24 * fVar15);
                local_c8._4_4_ =
                     (fVar27 * local_118 +
                      -local_f8 * fVar26 + fVar19 * fVar23 + fVar17 * fStack_114 + local_108._4_4_)
                     - (fVar12 * fVar22 + -fVar15 * fVar20 + fVar9 * fVar14 + fVar18 * fVar13);
                local_c8._0_4_ =
                     (fVar26 * fStack_f4 +
                      fVar21 * fVar17 + -local_f8 * fVar23 + fVar27 * fStack_114 + (float)local_108)
                     - (fVar16 * fVar20 + fVar10 * fVar18 + -fVar15 * fVar14 + fVar22 * fVar13);
                local_c8._8_4_ =
                     (local_f8 * fVar17 + fVar27 * fVar19 + fVar21 * fVar23 + fStack_114 * fVar26 +
                     fVar11) - (fVar18 * fVar15 + fVar22 * fVar9 + fVar14 * fVar10 + fVar20 * fVar13
                               );
                local_c8._12_4_ = 0;
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                fVar14 = local_b8.m_el[0].m_floats[2];
                fVar9 = local_b8.m_el[0].m_floats[3];
                pbVar4 = (this_00->m_links).m_data;
                fVar11 = *(float *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 8);
                uVar1 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8);
                uVar2 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 4);
                fVar17 = (float)uVar1;
                fVar18 = (float)((ulong)uVar1 >> 0x20);
                fVar12 = local_b8.m_el[0].m_floats[0];
                fVar10 = (fVar9 * fVar18 + fVar14 * fVar17) - fVar12 * fVar11;
                fVar13 = local_b8.m_el[0].m_floats[1];
                fVar15 = (fVar11 * fVar9 + (float)uVar2 * fVar12) - fVar13 * fVar17;
                fVar16 = (fVar17 * fVar9 + (float)((ulong)uVar2 >> 0x20) * fVar13) - fVar14 * fVar18
                ;
                fVar19 = -fVar13;
                fVar20 = -fVar14;
                fVar11 = fVar11 * fVar20 + (fVar18 * fVar19 - fVar17 * fVar12);
                uVar1 = *(undefined8 *)
                         ((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8);
                local_d8._4_4_ =
                     (float)((ulong)uVar1 >> 0x20) -
                     (fVar14 * fVar16 + -fVar12 * fVar15 + fVar19 * fVar11 + fVar10 * fVar9);
                local_d8._0_4_ =
                     (float)uVar1 -
                     (fVar13 * fVar15 + fVar20 * fVar10 + -fVar12 * fVar11 + fVar16 * fVar9);
                local_d8._8_4_ =
                     *(float *)((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8 + 8
                               ) -
                     (fVar10 * fVar12 + fVar16 * fVar19 + fVar11 * fVar20 + fVar15 * fVar9);
                local_d8._12_4_ = 0;
                iVar5 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                          super_btCollisionWorld._vptr_btCollisionWorld[5])();
                (**(code **)(*(long *)CONCAT44(extraout_var_04,iVar5) + 0x20))
                          ((long *)CONCAT44(extraout_var_04,iVar5),local_c8,local_d8,&local_138);
              }
              if (*(int *)((long)(((this_00->m_links).m_data)->m_cachedWorldTransform).m_basis.m_el
                                 [0].m_floats + lVar8 + -0xc) == 1) {
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                local_f8 = local_b8.m_el[0].m_floats[0];
                fStack_f4 = local_b8.m_el[0].m_floats[1];
                uStack_f0 = 0;
                local_118 = local_b8.m_el[0].m_floats[2];
                fStack_114 = local_b8.m_el[0].m_floats[3];
                uStack_110 = 0;
                pbVar4 = (this_00->m_links).m_data;
                local_e8 = ZEXT416(*(uint *)((long)pbVar4->m_axes[0].m_bottomVec.m_floats +
                                            lVar8 + 8));
                local_128 = *(undefined8 *)((long)pbVar4->m_axes[0].m_bottomVec.m_floats + lVar8);
                uStack_120 = 0;
                local_138.super_btQuadWord.m_floats[0] = 0.0;
                local_138.super_btQuadWord.m_floats[1] = 0.0;
                local_138.super_btQuadWord.m_floats[2] = 0.0;
                local_138.super_btQuadWord.m_floats[3] = 1.0;
                local_108 = *(undefined8 *)
                             ((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8);
                uStack_100 = 0;
                fVar11 = *(float *)((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats +
                                   lVar8 + 8);
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                fVar17 = (fStack_114 * local_128._4_4_ + local_118 * (float)local_128) -
                         local_f8 * (float)local_e8._0_4_;
                fVar15 = local_b8.m_el[0].m_floats[0];
                fVar16 = local_b8.m_el[0].m_floats[1];
                fVar19 = -fStack_f4;
                fVar21 = -local_118;
                fVar23 = fVar21 * (float)local_e8._0_4_ +
                         (local_128._4_4_ * fVar19 - local_f8 * (float)local_128);
                pbVar4 = (this_00->m_links).m_data;
                fVar26 = ((float)local_e8._0_4_ * fStack_114 + local_128._4_4_ * local_f8) -
                         (float)local_128 * fStack_f4;
                fVar27 = ((float)local_128 * fStack_114 + (float)local_e8._0_4_ * fStack_f4) -
                         local_128._4_4_ * local_118;
                fVar12 = local_b8.m_el[0].m_floats[2];
                fVar13 = local_b8.m_el[0].m_floats[3];
                fVar14 = *(float *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 8);
                uVar1 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8);
                uVar2 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 4);
                fVar24 = (float)uVar1;
                fVar25 = (float)((ulong)uVar1 >> 0x20);
                fVar18 = (fVar13 * fVar25 + fVar12 * fVar24) - fVar15 * fVar14;
                fVar20 = (fVar14 * fVar13 + (float)uVar2 * fVar15) - fVar16 * fVar24;
                fVar22 = (fVar24 * fVar13 + (float)((ulong)uVar2 >> 0x20) * fVar16) -
                         fVar12 * fVar25;
                fVar9 = -fVar16;
                fVar10 = -fVar12;
                fVar14 = fVar14 * fVar10 + (fVar25 * fVar9 - fVar24 * fVar15);
                local_c8._4_4_ =
                     (fVar27 * local_118 +
                      -local_f8 * fVar26 + fVar19 * fVar23 + fVar17 * fStack_114 + local_108._4_4_)
                     - (fVar12 * fVar22 + -fVar15 * fVar20 + fVar9 * fVar14 + fVar18 * fVar13);
                local_c8._0_4_ =
                     (fVar26 * fStack_f4 +
                      fVar21 * fVar17 + -local_f8 * fVar23 + fVar27 * fStack_114 + (float)local_108)
                     - (fVar16 * fVar20 + fVar10 * fVar18 + -fVar15 * fVar14 + fVar22 * fVar13);
                local_c8._8_4_ =
                     (local_f8 * fVar17 + fVar27 * fVar19 + fVar21 * fVar23 + fStack_114 * fVar26 +
                     fVar11) - (fVar18 * fVar15 + fVar22 * fVar9 + fVar14 * fVar10 + fVar20 * fVar13
                               );
                local_c8._12_4_ = 0;
                btMatrix3x3::getRotation(this_01,(btQuaternion *)&local_b8);
                fVar14 = local_b8.m_el[0].m_floats[2];
                fVar9 = local_b8.m_el[0].m_floats[3];
                pbVar4 = (this_00->m_links).m_data;
                fVar11 = *(float *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 8);
                uVar1 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8);
                uVar2 = *(undefined8 *)((long)(pbVar4->m_dVector).m_floats + lVar8 + 4);
                fVar17 = (float)uVar1;
                fVar18 = (float)((ulong)uVar1 >> 0x20);
                fVar12 = local_b8.m_el[0].m_floats[0];
                fVar10 = (fVar9 * fVar18 + fVar14 * fVar17) - fVar12 * fVar11;
                fVar13 = local_b8.m_el[0].m_floats[1];
                fVar15 = (fVar11 * fVar9 + (float)uVar2 * fVar12) - fVar13 * fVar17;
                fVar16 = (fVar17 * fVar9 + (float)((ulong)uVar2 >> 0x20) * fVar13) - fVar14 * fVar18
                ;
                fVar19 = -fVar13;
                fVar20 = -fVar14;
                fVar11 = fVar11 * fVar20 + (fVar18 * fVar19 - fVar17 * fVar12);
                uVar1 = *(undefined8 *)
                         ((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8);
                local_d8._4_4_ =
                     (float)((ulong)uVar1 >> 0x20) -
                     (fVar14 * fVar16 + -fVar12 * fVar15 + fVar19 * fVar11 + fVar10 * fVar9);
                local_d8._0_4_ =
                     (float)uVar1 -
                     (fVar13 * fVar15 + fVar20 * fVar10 + -fVar12 * fVar11 + fVar16 * fVar9);
                local_d8._8_4_ =
                     *(float *)((long)(pbVar3->m_cachedWorldTransform).m_origin.m_floats + lVar8 + 8
                               ) -
                     (fVar10 * fVar12 + fVar16 * fVar19 + fVar11 * fVar20 + fVar15 * fVar9);
                local_d8._12_4_ = 0;
                iVar5 = (*(this->super_btDiscreteDynamicsWorld).super_btDynamicsWorld.
                          super_btCollisionWorld._vptr_btCollisionWorld[5])();
                (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar5) + 0x20))
                          ((long *)CONCAT44(extraout_var_05,iVar5),local_c8,local_d8,&local_138);
              }
              lVar7 = lVar7 + 1;
              lVar8 = lVar8 + 600;
            } while (lVar7 < (this_00->m_links).m_size);
          }
          lVar7 = local_78 + 1;
        } while (lVar7 < (this->m_multiBodies).m_size);
      }
      btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&local_70);
      btAlignedObjectArray<btQuaternion>::~btAlignedObjectArray(&local_50);
      CProfileManager::Stop_Profile();
    }
  }
  btDiscreteDynamicsWorld::debugDrawWorld(&this->super_btDiscreteDynamicsWorld);
  CProfileManager::Stop_Profile();
  return;
}

Assistant:

void	btMultiBodyDynamicsWorld::debugDrawWorld()
{
	BT_PROFILE("btMultiBodyDynamicsWorld debugDrawWorld");

	bool drawConstraints = false;
	if (getDebugDrawer())
	{
		int mode = getDebugDrawer()->getDebugMode();
		if (mode  & (btIDebugDraw::DBG_DrawConstraints | btIDebugDraw::DBG_DrawConstraintLimits))
		{
			drawConstraints = true;
		}

		if (drawConstraints)
		{
			BT_PROFILE("btMultiBody debugDrawWorld");
			
			btAlignedObjectArray<btQuaternion> world_to_local1;
			btAlignedObjectArray<btVector3> local_origin1;

			for (int c=0;c<m_multiBodyConstraints.size();c++)
			{
				btMultiBodyConstraint* constraint = m_multiBodyConstraints[c];
				debugDrawMultiBodyConstraint(constraint);
			}

			for (int b = 0; b<m_multiBodies.size(); b++)
			{
				btMultiBody* bod = m_multiBodies[b];
				bod->forwardKinematics(world_to_local1,local_origin1);
				
				getDebugDrawer()->drawTransform(bod->getBaseWorldTransform(), 0.1);


				for (int m = 0; m<bod->getNumLinks(); m++)
				{
					
					const btTransform& tr = bod->getLink(m).m_cachedWorldTransform;

					getDebugDrawer()->drawTransform(tr, 0.1);

						//draw the joint axis
					if (bod->getLink(m).m_jointType==btMultibodyLink::eRevolute)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_topVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					if (bod->getLink(m).m_jointType==btMultibodyLink::eFixed)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_bottomVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					if (bod->getLink(m).m_jointType==btMultibodyLink::ePrismatic)
					{
						btVector3 vec = quatRotate(tr.getRotation(),bod->getLink(m).m_axes[0].m_bottomVec);
					
						btVector4 color(0,0,0,1);//1,1,1);
						btVector3 from = vec+tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						btVector3 to = tr.getOrigin()-quatRotate(tr.getRotation(),bod->getLink(m).m_dVector);
						getDebugDrawer()->drawLine(from,to,color);
					}
					
				}
			}
		}
	}

	btDiscreteDynamicsWorld::debugDrawWorld();
}